

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t *
container_lazy_ixor(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type
                   )

{
  bitset_container_t *pbVar1;
  int iVar2;
  bitset_container_t *bc;
  uint8_t *result_type_local;
  bitset_container_t *pbStack_28;
  uint8_t type2_local;
  container_t *c2_local;
  bitset_container_t *pbStack_18;
  uint8_t type1_local;
  container_t *c1_local;
  
  result_type_local._7_1_ = type2;
  pbStack_28 = (bitset_container_t *)c2;
  c2_local._7_1_ = type1;
  pbStack_18 = (bitset_container_t *)c1;
  if (type1 == '\x04') {
    __assert_fail("type1 != SHARED_CONTAINER_TYPE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x16fb,
                  "container_t *container_lazy_ixor(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  }
  pbStack_28 = (bitset_container_t *)
               container_unwrap_shared(c2,(uint8_t *)((long)&result_type_local + 7));
  pbVar1 = pbStack_18;
  if ((uint)result_type_local._7_1_ + (uint)c2_local._7_1_ * 4 == 5) {
    bitset_container_xor_nocard(pbStack_18,pbStack_28,pbStack_18);
    *result_type = '\x01';
    c1_local = pbStack_18;
  }
  else {
    if ((c2_local._7_1_ == 1) && (pbStack_18->cardinality == -1)) {
      iVar2 = bitset_container_compute_cardinality(pbStack_18);
      pbVar1->cardinality = iVar2;
    }
    c1_local = container_ixor(pbStack_18,c2_local._7_1_,pbStack_28,result_type_local._7_1_,
                              result_type);
  }
  return c1_local;
}

Assistant:

static inline container_t *container_lazy_ixor(
    container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    assert(type1 != SHARED_CONTAINER_TYPE);
    // c1 = get_writable_copy_if_shared(c1,&type1);
    c2 = container_unwrap_shared(c2, &type2);
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            bitset_container_xor_nocard(CAST_bitset(c1),
                                        const_CAST_bitset(c2),
                                        CAST_bitset(c1));  // is lazy
            *result_type = BITSET_CONTAINER_TYPE;
            return c1;

        // TODO: other cases being lazy, esp. when we know inplace not likely
        // could see the corresponding code for union
        default:
            // we may have a dirty bitset (without a precomputed cardinality)
            // and calling container_ixor on it might be unsafe.
            if (type1 == BITSET_CONTAINER_TYPE) {
                bitset_container_t *bc = CAST_bitset(c1);
                if (bc->cardinality == BITSET_UNKNOWN_CARDINALITY) {
                    bc->cardinality = bitset_container_compute_cardinality(bc);
                }
            }
            return container_ixor(c1, type1, c2, type2, result_type);
    }
}